

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool __thiscall FIX::Session::doTargetTooLow(Session *this,Message *msg)

{
  bool bVar1;
  ostream *poVar2;
  SEQNUM SVar3;
  logic_error *this_00;
  string local_260 [32];
  string local_240;
  stringstream local_220 [8];
  stringstream stream;
  ostream local_210 [376];
  FieldBase *local_98;
  MsgSeqNum *msgSeqNum;
  BOOLEAN local_79;
  undefined1 local_78 [8];
  PossDupFlag possDupFlag;
  Header *header;
  Message *msg_local;
  Session *this_local;
  
  possDupFlag.super_BoolField.super_FieldBase.m_metrics = (field_metrics)Message::getHeader(msg);
  local_79 = false;
  PossDupFlag::PossDupFlag((PossDupFlag *)local_78,&local_79);
  FieldMap::getFieldIfSet
            ((FieldMap *)possDupFlag.super_BoolField.super_FieldBase.m_metrics,(FieldBase *)local_78
            );
  local_98 = (FieldBase *)
             FieldMap::getField<FIX::MsgSeqNum>
                       ((FieldMap *)possDupFlag.super_BoolField.super_FieldBase.m_metrics);
  bVar1 = BoolField::operator_cast_to_bool((BoolField *)local_78);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_220);
    poVar2 = std::operator<<(local_210,"MsgSeqNum too low, expecting ");
    SVar3 = getExpectedTargetNum(this);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,SVar3);
    poVar2 = std::operator<<(poVar2," but received ");
    operator<<(poVar2,local_98);
    std::__cxx11::stringstream::str();
    generateLogout(this,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::logic_error::logic_error(this_00,local_260);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar1 = doPossDup(this,msg);
  PossDupFlag::~PossDupFlag((PossDupFlag *)local_78);
  return bVar1;
}

Assistant:

bool Session::doTargetTooLow(const Message &msg) {
  const Header &header = msg.getHeader();
  PossDupFlag possDupFlag(false);
  header.getFieldIfSet(possDupFlag);
  auto const &msgSeqNum = header.getField<MsgSeqNum>();

  if (!possDupFlag) {
    std::stringstream stream;
    stream << "MsgSeqNum too low, expecting " << getExpectedTargetNum() << " but received " << msgSeqNum;
    generateLogout(stream.str());
    throw std::logic_error(stream.str());
  }

  return doPossDup(msg);
}